

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

bool duckdb_yyjson::yyjson_val_write_fp
               (FILE *fp,yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,
               yyjson_write_err *err)

{
  char *__ptr;
  size_t sVar1;
  yyjson_write_err *pyVar2;
  undefined **alc_ptr_00;
  yyjson_write_err *err_00;
  usize dat_len;
  yyjson_write_err dummy_err;
  
  dat_len = 0;
  alc_ptr_00 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    alc_ptr_00 = &alc_ptr->malloc;
  }
  err_00 = err;
  if (err == (yyjson_write_err *)0x0) {
    err_00 = &dummy_err;
  }
  if (fp == (FILE *)0x0) {
    pyVar2 = &dummy_err;
    if (err != (yyjson_write_err *)0x0) {
      pyVar2 = err;
    }
    pyVar2->msg = "input fp is invalid";
    err_00->code = 1;
  }
  else {
    __ptr = yyjson_val_write_opts(val,flg,(yyjson_alc *)alc_ptr_00,&dat_len,err_00);
    if (__ptr != (char *)0x0) {
      sVar1 = fwrite(__ptr,dat_len,1,(FILE *)fp);
      if (sVar1 != 1) {
        pyVar2 = &dummy_err;
        if (err != (yyjson_write_err *)0x0) {
          pyVar2 = err;
        }
        pyVar2->msg = "file writing failed";
        err_00->code = 6;
      }
      (*((yyjson_alc *)alc_ptr_00)->free)(((yyjson_alc *)alc_ptr_00)->ctx,__ptr);
      return sVar1 == 1;
    }
  }
  return false;
}

Assistant:

bool yyjson_val_write_fp(FILE *fp,
                         const yyjson_val *val,
                         yyjson_write_flag flg,
                         const yyjson_alc *alc_ptr,
                         yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    u8 *dat;
    usize dat_len = 0;
    yyjson_val *root = constcast(yyjson_val *)val;
    bool suc;

    alc_ptr = alc_ptr ? alc_ptr : &YYJSON_DEFAULT_ALC;
    err = err ? err : &dummy_err;
    if (unlikely(!fp)) {
        err->msg = "input fp is invalid";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return false;
    }

    dat = (u8 *)yyjson_val_write_opts(root, flg, alc_ptr, &dat_len, err);
    if (unlikely(!dat)) return false;
    suc = write_dat_to_fp(fp, dat, dat_len, err);
    alc_ptr->free(alc_ptr->ctx, dat);
    return suc;
}